

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c14n.c
# Opt level: O0

int xmlC14NProcessAttrsAxis(xmlC14NCtxPtr ctx,xmlNodePtr cur,int parent_visible)

{
  xmlC14NMode xVar1;
  bool bVar2;
  int iVar3;
  xmlListPtr l;
  void *pvVar4;
  xmlAttrPtr data;
  _xmlNode *p_Stack_60;
  int matched;
  xmlNodePtr tmp;
  xmlAttrPtr xml_space_attr;
  xmlAttrPtr xml_lang_attr;
  xmlAttrPtr xml_base_attr;
  xmlAttrPtr attrs_to_delete;
  xmlListPtr list;
  xmlAttrPtr attr;
  int parent_visible_local;
  xmlNodePtr cur_local;
  xmlC14NCtxPtr ctx_local;
  
  xml_base_attr = (xmlAttrPtr)0x0;
  xml_lang_attr = (xmlAttrPtr)0x0;
  xml_space_attr = (xmlAttrPtr)0x0;
  tmp = (xmlNodePtr)0x0;
  if (((ctx == (xmlC14NCtxPtr)0x0) || (cur == (xmlNodePtr)0x0)) || (cur->type != XML_ELEMENT_NODE))
  {
    xmlC14NErrParam("processing attributes axis");
    ctx_local._4_4_ = -1;
  }
  else {
    l = xmlListCreate((xmlListDeallocator)0x0,xmlC14NAttrsCompare);
    if (l == (xmlListPtr)0x0) {
      xmlC14NErrInternal("creating attributes list");
      ctx_local._4_4_ = -1;
    }
    else {
      xVar1 = ctx->mode;
      if (xVar1 == XML_C14N_1_0) {
        for (list = (xmlListPtr)cur->properties; list != (xmlListPtr)0x0;
            list = (xmlListPtr)list[2].sentinel) {
          if ((ctx->is_visible_callback == (xmlC14NIsVisibleCallback)0x0) ||
             (iVar3 = (*ctx->is_visible_callback)(ctx->user_data,(xmlNodePtr)list,cur), iVar3 != 0))
          {
            xmlListInsert(l,list);
          }
        }
        if (((parent_visible != 0) && (cur->parent != (_xmlNode *)0x0)) &&
           ((ctx->is_visible_callback != (xmlC14NIsVisibleCallback)0x0 &&
            (iVar3 = (*ctx->is_visible_callback)(ctx->user_data,cur->parent,cur->parent->parent),
            iVar3 == 0)))) {
          for (p_Stack_60 = cur->parent; p_Stack_60 != (_xmlNode *)0x0;
              p_Stack_60 = p_Stack_60->parent) {
            for (list = (xmlListPtr)p_Stack_60->properties; list != (xmlListPtr)0x0;
                list = (xmlListPtr)list[2].sentinel) {
              iVar3 = xmlC14NIsXmlAttr((xmlAttrPtr)list);
              if ((iVar3 != 0) && (pvVar4 = xmlListSearch(l,list), pvVar4 == (void *)0x0)) {
                xmlListInsert(l,list);
              }
            }
          }
        }
      }
      else if (xVar1 == XML_C14N_EXCLUSIVE_1_0) {
        for (list = (xmlListPtr)cur->properties; list != (xmlListPtr)0x0;
            list = (xmlListPtr)list[2].sentinel) {
          if ((ctx->is_visible_callback == (xmlC14NIsVisibleCallback)0x0) ||
             (iVar3 = (*ctx->is_visible_callback)(ctx->user_data,(xmlNodePtr)list,cur), iVar3 != 0))
          {
            xmlListInsert(l,list);
          }
        }
      }
      else if (xVar1 == XML_C14N_1_1) {
        for (list = (xmlListPtr)cur->properties; list != (xmlListPtr)0x0;
            list = (xmlListPtr)list[2].sentinel) {
          if ((parent_visible == 0) || (iVar3 = xmlC14NIsXmlAttr((xmlAttrPtr)list), iVar3 == 0)) {
            if ((ctx->is_visible_callback == (xmlC14NIsVisibleCallback)0x0) ||
               (iVar3 = (*ctx->is_visible_callback)(ctx->user_data,(xmlNodePtr)list,cur), iVar3 != 0
               )) {
              xmlListInsert(l,list);
            }
          }
          else {
            bVar2 = false;
            if ((xml_space_attr == (xmlAttrPtr)0x0) &&
               (iVar3 = xmlStrEqual((xmlChar *)list->linkCompare,"lang"), iVar3 != 0)) {
              xml_space_attr = (xmlAttrPtr)list;
              bVar2 = true;
            }
            if (((!bVar2) && (tmp == (xmlNodePtr)0x0)) &&
               (iVar3 = xmlStrEqual((xmlChar *)list->linkCompare,"space"), iVar3 != 0)) {
              tmp = (xmlNodePtr)list;
              bVar2 = true;
            }
            if (((!bVar2) && (xml_lang_attr == (xmlAttrPtr)0x0)) &&
               (iVar3 = xmlStrEqual((xmlChar *)list->linkCompare,"base"), iVar3 != 0)) {
              xml_lang_attr = (xmlAttrPtr)list;
              bVar2 = true;
            }
            if ((!bVar2) &&
               ((ctx->is_visible_callback == (xmlC14NIsVisibleCallback)0x0 ||
                (iVar3 = (*ctx->is_visible_callback)(ctx->user_data,(xmlNodePtr)list,cur),
                iVar3 != 0)))) {
              xmlListInsert(l,list);
            }
          }
        }
        if (parent_visible != 0) {
          if (xml_space_attr == (xmlAttrPtr)0x0) {
            xml_space_attr =
                 xmlC14NFindHiddenParentAttr
                           (ctx,cur->parent,"lang",(xmlChar *)"http://www.w3.org/XML/1998/namespace"
                           );
          }
          if (xml_space_attr != (xmlAttrPtr)0x0) {
            xmlListInsert(l,xml_space_attr);
          }
          if (tmp == (xmlNodePtr)0x0) {
            tmp = (xmlNodePtr)
                  xmlC14NFindHiddenParentAttr
                            (ctx,cur->parent,"space",
                             (xmlChar *)"http://www.w3.org/XML/1998/namespace");
          }
          if (tmp != (xmlNodePtr)0x0) {
            xmlListInsert(l,tmp);
          }
          if (xml_lang_attr == (xmlAttrPtr)0x0) {
            xml_lang_attr =
                 xmlC14NFindHiddenParentAttr
                           (ctx,cur->parent,"base",(xmlChar *)"http://www.w3.org/XML/1998/namespace"
                           );
          }
          if ((xml_lang_attr != (xmlAttrPtr)0x0) &&
             (data = xmlC14NFixupBaseAttr(ctx,xml_lang_attr), data != (xmlAttrPtr)0x0)) {
            xmlListInsert(l,data);
            data->next = (_xmlAttr *)0x0;
            xml_base_attr = data;
          }
        }
      }
      xmlListWalk(l,xmlC14NPrintAttrs,ctx);
      xmlFreePropList(xml_base_attr);
      xmlListDelete(l);
      ctx_local._4_4_ = 0;
    }
  }
  return ctx_local._4_4_;
}

Assistant:

static int
xmlC14NProcessAttrsAxis(xmlC14NCtxPtr ctx, xmlNodePtr cur, int parent_visible)
{
    xmlAttrPtr attr;
    xmlListPtr list;
    xmlAttrPtr attrs_to_delete = NULL;

    /* special processing for 1.1 spec */
    xmlAttrPtr xml_base_attr = NULL;
    xmlAttrPtr xml_lang_attr = NULL;
    xmlAttrPtr xml_space_attr = NULL;

    if ((ctx == NULL) || (cur == NULL) || (cur->type != XML_ELEMENT_NODE)) {
        xmlC14NErrParam("processing attributes axis");
        return (-1);
    }

    /*
     * Create a sorted list to store element attributes
     */
    list = xmlListCreate(NULL, xmlC14NAttrsCompare);
    if (list == NULL) {
        xmlC14NErrInternal("creating attributes list");
        return (-1);
    }

    switch(ctx->mode) {
    case XML_C14N_1_0:
        /* The processing of an element node E MUST be modified slightly when an XPath node-set is
         * given as input and the element's parent is omitted from the node-set. The method for processing
         * the attribute axis of an element E in the node-set is enhanced. All element nodes along E's
         * ancestor axis are examined for nearest occurrences of attributes in the xml namespace, such
         * as xml:lang and xml:space (whether or not they are in the node-set). From this list of attributes,
         * remove any that are in E's attribute axis (whether or not they are in the node-set). Then,
         * lexicographically merge this attribute list with the nodes of E's attribute axis that are in
         * the node-set. The result of visiting the attribute axis is computed by processing the attribute
         * nodes in this merged attribute list.
         */

        /*
         * Add all visible attributes from current node.
         */
        attr = cur->properties;
        while (attr != NULL) {
            /* check that attribute is visible */
            if (xmlC14NIsVisible(ctx, attr, cur)) {
                xmlListInsert(list, attr);
            }
            attr = attr->next;
        }

        /*
         * Handle xml attributes
         */
        if (parent_visible && (cur->parent != NULL) &&
            (!xmlC14NIsVisible(ctx, cur->parent, cur->parent->parent)))
        {
            xmlNodePtr tmp;

            /*
             * If XPath node-set is not specified then the parent is always
             * visible!
             */
            tmp = cur->parent;
            while (tmp != NULL) {
                attr = tmp->properties;
                while (attr != NULL) {
                    if (xmlC14NIsXmlAttr(attr) != 0) {
                        if (xmlListSearch(list, attr) == NULL) {
                            xmlListInsert(list, attr);
                        }
                    }
                    attr = attr->next;
                }
                tmp = tmp->parent;
            }
        }

        /* done */
        break;
    case XML_C14N_EXCLUSIVE_1_0:
        /* attributes in the XML namespace, such as xml:lang and xml:space
         * are not imported into orphan nodes of the document subset
         */

        /*
         * Add all visible attributes from current node.
         */
        attr = cur->properties;
        while (attr != NULL) {
            /* check that attribute is visible */
            if (xmlC14NIsVisible(ctx, attr, cur)) {
                xmlListInsert(list, attr);
            }
            attr = attr->next;
        }

        /* do nothing special for xml attributes */
        break;
    case XML_C14N_1_1:
        /* The processing of an element node E MUST be modified slightly when an XPath node-set is
         * given as input and some of the element's ancestors are omitted from the node-set.
         *
         * Simple inheritable attributes are attributes that have a value that requires at most a simple
         * redeclaration. This redeclaration is done by supplying a new value in the child axis. The
         * redeclaration of a simple inheritable attribute A contained in one of E's ancestors is done
         * by supplying a value to an attribute Ae inside E with the same name. Simple inheritable attributes
         * are xml:lang and xml:space.
         *
         * The method for processing the attribute axis of an element E in the node-set is hence enhanced.
         * All element nodes along E's ancestor axis are examined for the nearest occurrences of simple
         * inheritable attributes in the xml namespace, such as xml:lang and xml:space (whether or not they
         * are in the node-set). From this list of attributes, any simple inheritable attributes that are
         * already in E's attribute axis (whether or not they are in the node-set) are removed. Then,
         * lexicographically merge this attribute list with the nodes of E's attribute axis that are in
         * the node-set. The result of visiting the attribute axis is computed by processing the attribute
         * nodes in this merged attribute list.
         *
         * The xml:id attribute is not a simple inheritable attribute and no processing of these attributes is
         * performed.
         *
         * The xml:base attribute is not a simple inheritable attribute and requires special processing beyond
         * a simple redeclaration.
         *
         * Attributes in the XML namespace other than xml:base, xml:id, xml:lang, and xml:space MUST be processed
         * as ordinary attributes.
         */

        /*
         * Add all visible attributes from current node.
         */
        attr = cur->properties;
        while (attr != NULL) {
            /* special processing for XML attribute kiks in only when we have invisible parents */
            if ((!parent_visible) || (xmlC14NIsXmlAttr(attr) == 0)) {
                /* check that attribute is visible */
                if (xmlC14NIsVisible(ctx, attr, cur)) {
                    xmlListInsert(list, attr);
                }
            } else {
                int matched = 0;

                /* check for simple inheritance attributes */
                if((!matched) && (xml_lang_attr == NULL) && xmlStrEqual(attr->name, BAD_CAST "lang")) {
                    xml_lang_attr = attr;
                    matched = 1;
                }
                if((!matched) && (xml_space_attr == NULL) && xmlStrEqual(attr->name, BAD_CAST "space")) {
                    xml_space_attr = attr;
                    matched = 1;
                }

                /* check for base attr */
                if((!matched) && (xml_base_attr == NULL) && xmlStrEqual(attr->name, BAD_CAST "base")) {
                    xml_base_attr = attr;
                    matched = 1;
                }

                /* otherwise, it is a normal attribute, so just check if it is visible */
                if((!matched) && xmlC14NIsVisible(ctx, attr, cur)) {
                    xmlListInsert(list, attr);
                }
            }

            /* move to the next one */
            attr = attr->next;
        }

        /* special processing for XML attribute kiks in only when we have invisible parents */
        if ((parent_visible)) {

            /* simple inheritance attributes - copy */
            if(xml_lang_attr == NULL) {
                xml_lang_attr = xmlC14NFindHiddenParentAttr(ctx, cur->parent, BAD_CAST "lang", XML_XML_NAMESPACE);
            }
            if(xml_lang_attr != NULL) {
                xmlListInsert(list, xml_lang_attr);
            }
            if(xml_space_attr == NULL) {
                xml_space_attr = xmlC14NFindHiddenParentAttr(ctx, cur->parent, BAD_CAST "space", XML_XML_NAMESPACE);
            }
            if(xml_space_attr != NULL) {
                xmlListInsert(list, xml_space_attr);
            }

            /* base uri attribute - fix up */
            if(xml_base_attr == NULL) {
                /* if we don't have base uri attribute, check if we have a "hidden" one above */
                xml_base_attr = xmlC14NFindHiddenParentAttr(ctx, cur->parent, BAD_CAST "base", XML_XML_NAMESPACE);
            }
            if(xml_base_attr != NULL) {
                xml_base_attr = xmlC14NFixupBaseAttr(ctx, xml_base_attr);
                if(xml_base_attr != NULL) {
                    xmlListInsert(list, xml_base_attr);

                    /* note that we MUST delete returned attr node ourselves! */
                    xml_base_attr->next = attrs_to_delete;
                    attrs_to_delete = xml_base_attr;
                }
            }
        }

        /* done */
        break;
    }

    /*
     * print out all elements from list
     */
    xmlListWalk(list, xmlC14NPrintAttrs, (void *) ctx);

    /*
     * Cleanup
     */
    xmlFreePropList(attrs_to_delete);
    xmlListDelete(list);
    return (0);
}